

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<6UL>::SetWritable
          (SimpleTypeHandler<6UL> *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  Type *oldType;
  JavascriptLibrary *pJVar1;
  ScriptContext *pSVar2;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  bool bVar3;
  PropertyIndex in_AX;
  BOOL BVar4;
  int iVar5;
  PropertyId propertyId_00;
  DynamicTypeHandler *pDVar6;
  uint uVar7;
  uint uVar8;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_48;
  uint32 local_3c;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *pPStack_38;
  uint32 indexVal;
  
  iVar5 = this->propertyCount;
  bVar3 = 0 < iVar5;
  if (0 < iVar5) {
    if ((this->descriptors[0].Id.ptr)->pid == propertyId) {
      bVar3 = true;
      in_AX = 0;
    }
    else {
      uVar8 = 1;
      do {
        in_AX = (PropertyIndex)uVar8;
        uVar7 = uVar8 & 0xffff;
        bVar3 = (int)uVar7 < iVar5;
        if (iVar5 <= (int)uVar7) break;
        uVar8 = uVar7 + 1;
      } while (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar7 << 4)) + 8) !=
               propertyId);
    }
  }
  oldType = (instance->super_RecyclableObject).type.ptr;
  if (bVar3) {
    if (value == 0) {
      BVar4 = ClearAttribute(this,instance,in_AX,'\x04');
      iVar5 = 1;
      if (BVar4 != 0) {
        DynamicObject::ChangeTypeIf(instance,oldType);
        pDVar6 = DynamicTypeHandler::GetCurrentTypeHandler(instance);
        pJVar1 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
        pPStack_38 = &pJVar1->typesWithOnlyWritablePropertyProtoChain;
        Memory::Recycler::WBSetBit((char *)&local_48);
        local_48 = pPStack_38;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
        this_00 = local_48;
        pSVar2 = (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr;
        DynamicTypeHandler::SetHasOnlyWritableDataProperties(pDVar6,false);
        if ((pDVar6->flags & 0x20) != 0) {
          propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(pSVar2,propertyId);
          ScriptContext::InvalidateStoreFieldCaches(pSVar2,propertyId_00);
          PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_00);
        }
      }
    }
    else {
      BVar4 = SetAttribute(this,instance,in_AX,'\x04');
      iVar5 = 1;
      if (BVar4 != 0) {
        DynamicObject::ChangeTypeIf(instance,oldType);
      }
    }
  }
  else {
    pPStack_38 = (PrototypeChainCache<Js::OnlyWritablePropertyCache> *)CONCAT44(indexVal,value);
    pSVar2 = (((oldType->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    bVar3 = DynamicObject::HasObjectArray(instance);
    iVar5 = 1;
    if ((bVar3) &&
       (BVar4 = ScriptContext::IsNumericPropertyId(pSVar2,propertyId,&local_3c), BVar4 != 0)) {
      pDVar6 = ConvertToTypeWithItemAttributes(this,instance);
      iVar5 = (*pDVar6->_vptr_DynamicTypeHandler[0x2a])
                        (pDVar6,instance,(ulong)(uint)propertyId,(ulong)pPStack_38 & 0xffffffff);
    }
  }
  return iVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        PropertyIndex index;
        if (!GetDescriptor(propertyId, &index))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            ScriptContext* scriptContext = instance->GetScriptContext();
            uint32 indexVal;
            if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
            {
                return SimpleTypeHandler<size>::ConvertToTypeWithItemAttributes(instance)
                    ->SetWritable(instance, propertyId, value);
            }
            return true;
        }

        const Type* oldType = instance->GetType();
        if (value)
        {
            if (SetAttribute(instance, index, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches
            }
        }
        else
        {
            if (ClearAttribute(instance, index, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches

                // Clearing the attribute may have changed the type handler, so make sure
                // we access the current one.
                DynamicTypeHandler* const typeHandler = GetCurrentTypeHandler(instance);
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(typeHandler, PropertyNone, propertyId, library->GetScriptContext());
            }
        }
        return true;
    }